

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O3

void __thiscall
deqp::gls::TheilSenCalibrator::recordIteration(TheilSenCalibrator *this,deUint64 iterationTime)

{
  float fVar1;
  iterator __position;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  deUint64 local_10;
  
  __position._M_current =
       (this->m_measureState).frameTimes.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_measureState).frameTimes.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_10 = iterationTime;
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)
               &(this->m_measureState).frameTimes,__position,&local_10);
  }
  else {
    *__position._M_current = iterationTime;
    (this->m_measureState).frameTimes.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if (this->m_state == INTERNALSTATE_RUNNING) {
    puVar2 = (this->m_measureState).frameTimes.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(this->m_measureState).frameTimes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2;
    if (((this->m_measureState).maxNumFrames <= (int)(lVar3 >> 3)) ||
       (((1 < (ulong)(lVar3 >> 3) &&
         (fVar1 = (this->m_measureState).frameShortcutTime, uVar4 = (ulong)fVar1,
         uVar4 = (long)(fVar1 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4,
         uVar4 <= *(ulong *)((long)puVar2 + lVar3 + -0x10))) &&
        (uVar4 <= *(ulong *)((long)puVar2 + lVar3 + -8))))) {
      this->m_state = INTERNALSTATE_FINISHED;
    }
  }
  return;
}

Assistant:

void TheilSenCalibrator::recordIteration (deUint64 iterationTime)
{
	DE_ASSERT((m_state == INTERNALSTATE_CALIBRATING || m_state == INTERNALSTATE_RUNNING) && !m_measureState.isDone());
	m_measureState.frameTimes.push_back(iterationTime);

	if (m_state == INTERNALSTATE_RUNNING && m_measureState.isDone())
		m_state = INTERNALSTATE_FINISHED;
}